

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

void llvm::APInt::tcShiftLeft(WordType *Dst,uint Words,uint Count)

{
  uint uVar1;
  sbyte sVar2;
  WordType *pWVar3;
  ulong uVar4;
  uint uVar5;
  
  if (Count == 0) {
    return;
  }
  uVar1 = Count >> 6;
  uVar4 = (ulong)Words;
  if (uVar1 < Words) {
    uVar4 = (ulong)uVar1;
  }
  uVar5 = (uint)uVar4;
  if ((Count & 0x3f) == 0) {
    memmove(Dst + uVar4,Dst,(ulong)((Words - uVar5) * 8));
  }
  else if (uVar1 < Words) {
    sVar2 = (sbyte)(Count & 0x3f);
    uVar4 = (ulong)(Words - 1);
    pWVar3 = Dst + uVar4;
    do {
      uVar1 = (uint)uVar4;
      uVar4 = Dst[-uVar5 + uVar1] << sVar2;
      *pWVar3 = uVar4;
      if (uVar5 < uVar1) {
        *pWVar3 = Dst[(-uVar5 + uVar1) - 1] >> (0x40U - sVar2 & 0x3f) | uVar4;
      }
      pWVar3 = pWVar3 + -1;
      uVar4 = (ulong)(uVar1 - 1);
    } while (uVar5 < uVar1);
  }
  memset(Dst,0,(ulong)(uVar5 << 3));
  return;
}

Assistant:

void APInt::tcShiftLeft(WordType *Dst, unsigned Words, unsigned Count) {
  // Don't bother performing a no-op shift.
  if (!Count)
    return;

  // WordShift is the inter-part shift; BitShift is the intra-part shift.
  unsigned WordShift = std::min(Count / APINT_BITS_PER_WORD, Words);
  unsigned BitShift = Count % APINT_BITS_PER_WORD;

  // Fastpath for moving by whole words.
  if (BitShift == 0) {
    std::memmove(Dst + WordShift, Dst, (Words - WordShift) * APINT_WORD_SIZE);
  } else {
    while (Words-- > WordShift) {
      Dst[Words] = Dst[Words - WordShift] << BitShift;
      if (Words > WordShift)
        Dst[Words] |=
          Dst[Words - WordShift - 1] >> (APINT_BITS_PER_WORD - BitShift);
    }
  }

  // Fill in the remainder with 0s.
  std::memset(Dst, 0, WordShift * APINT_WORD_SIZE);
}